

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O2

void AES_encrypt(uchar *in,uchar *out,AES_KEY *key)

{
  long lVar1;
  uchar *in_RCX;
  int iVar2;
  AES_state *round;
  long in_FS_OFFSET;
  AES_state s;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s.slice[0] = 0;
  s.slice[1] = 0;
  s.slice[2] = 0;
  s.slice[3] = 0;
  s.slice[4] = 0;
  s.slice[5] = 0;
  s.slice[6] = 0;
  s.slice[7] = 0;
  LoadBytes(&s,in_RCX);
  AddRoundKey(&s,(AES_state *)in);
  round = (AES_state *)(in + 0x10);
  iVar2 = 1;
  while( true ) {
    SubBytes(&s,0);
    ShiftRows(&s);
    if ((int)out <= iVar2) break;
    MixColumns(&s,0);
    AddRoundKey(&s,round);
    iVar2 = iVar2 + 1;
    round = round + 1;
  }
  AddRoundKey(&s,round);
  SaveBytes((uchar *)key,&s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void AES_encrypt(const AES_state* rounds, int nrounds, unsigned char* cipher16, const unsigned char* plain16) {
    AES_state s = {{0}};
    int round;

    LoadBytes(&s, plain16);
    AddRoundKey(&s, rounds++);

    for (round = 1; round < nrounds; round++) {
        SubBytes(&s, 0);
        ShiftRows(&s);
        MixColumns(&s, 0);
        AddRoundKey(&s, rounds++);
    }

    SubBytes(&s, 0);
    ShiftRows(&s);
    AddRoundKey(&s, rounds);

    SaveBytes(cipher16, &s);
}